

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O0

void __thiscall wasm::PrintSExpression::visitDefinedFunction(PrintSExpression *this,Function *curr)

{
  ulong uVar1;
  bool bVar2;
  Index IVar3;
  size_t sVar4;
  ostream *poVar5;
  Type type;
  ModuleStackIR *this_00;
  Block *pBVar6;
  Expression **ppEVar7;
  DebugLocation *pDVar8;
  optional<wasm::Function::DebugLocation> local_b0;
  Expression *local_98;
  Expression *item;
  Iterator __end3;
  Iterator __begin3;
  ExpressionList *__range3;
  Block *block;
  StackIR *stackIR;
  string_view local_50;
  ulong local_40;
  size_t i;
  Function *local_18;
  Function *curr_local;
  PrintSExpression *this_local;
  
  local_18 = curr;
  curr_local = (Function *)this;
  doIndent(this->o,this->indent);
  this->currFunction = local_18;
  std::optional<wasm::Function::DebugLocation>::operator=(&this->lastPrintedLocation);
  this->lastPrintIndent = 0;
  bVar2 = std::optional::operator_cast_to_bool((optional *)&this->currFunction->prologLocation);
  if (bVar2) {
    pDVar8 = std::optional<wasm::Function::DebugLocation>::operator*
                       (&this->currFunction->prologLocation);
    std::optional<wasm::Function::DebugLocation>::optional<wasm::Function::DebugLocation_&,_true>
              ((optional<wasm::Function::DebugLocation> *)((long)&i + 4),pDVar8);
    printDebugLocation(this,(optional<wasm::Function::DebugLocation> *)((long)&i + 4));
  }
  handleSignature(this,local_18,true);
  incIndent(this);
  IVar3 = Function::getVarIndexBase(local_18);
  for (local_40 = (ulong)IVar3; uVar1 = local_40, sVar4 = Function::getNumLocals(local_18),
      uVar1 < sVar4; local_40 = local_40 + 1) {
    doIndent(this->o,this->indent);
    std::operator<<(this->o,'(');
    poVar5 = this->o;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_50,"local ");
    printMinor(poVar5,local_50);
    poVar5 = anon_unknown_0::printLocal((Index)local_40,this->currFunction,this->o);
    std::operator<<(poVar5,' ');
    type = Function::getLocalType(local_18,(Index)local_40);
    poVar5 = printType(this,type);
    std::operator<<(poVar5,')');
    std::operator<<(this->o,this->maybeNewLine);
  }
  block = (Block *)0x0;
  bVar2 = std::optional::operator_cast_to_bool((optional *)&this->moduleStackIR);
  if (bVar2) {
    this_00 = std::optional<wasm::ModuleStackIR>::operator->(&this->moduleStackIR);
    block = (Block *)ModuleStackIR::getStackIROrNull(this_00,local_18);
  }
  if (block != (Block *)0x0) {
    printStackIR((StackIR *)block,this);
    goto LAB_0203320c;
  }
  if (((this->full & 1U) == 0) && (bVar2 = Expression::is<wasm::Block>(local_18->body), bVar2)) {
    pBVar6 = Expression::cast<wasm::Block>(local_18->body);
    bVar2 = IString::isNull(&(pBVar6->name).super_IString);
    if (!bVar2) goto LAB_020331c5;
    pBVar6 = Expression::cast<wasm::Block>(local_18->body);
    join_0x00000010_0x00000000_ =
         ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::begin
                   (&(pBVar6->list).
                     super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>);
    _item = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::end
                      (&(pBVar6->list).
                        super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>);
    while (bVar2 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::
                   operator!=((Iterator *)&__end3.index,(Iterator *)&item), bVar2) {
      ppEVar7 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::
                operator*((Iterator *)&__end3.index);
      local_98 = *ppEVar7;
      printFullLine(this,local_98);
      ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::operator++
                ((Iterator *)&__end3.index);
    }
  }
  else {
LAB_020331c5:
    printFullLine(this,local_18->body);
  }
  if (this->controlFlowDepth != 0) {
    __assert_fail("controlFlowDepth == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Print.cpp"
                  ,0xc82,"void wasm::PrintSExpression::visitDefinedFunction(Function *)");
  }
LAB_0203320c:
  bVar2 = std::optional::operator_cast_to_bool((optional *)&this->currFunction->epilogLocation);
  if (bVar2) {
    doIndent(this->o,this->indent);
    if ((this->minify & 1U) == 0) {
      this->indent = this->indent - 1;
    }
    pDVar8 = std::optional<wasm::Function::DebugLocation>::operator*
                       (&this->currFunction->epilogLocation);
    std::optional<wasm::Function::DebugLocation>::optional<wasm::Function::DebugLocation_&,_true>
              (&local_b0,pDVar8);
    printDebugLocation(this,&local_b0);
    std::operator<<(this->o,')');
  }
  else {
    decIndent(this);
  }
  std::operator<<(this->o,this->maybeNewLine);
  return;
}

Assistant:

void PrintSExpression::visitDefinedFunction(Function* curr) {
  doIndent(o, indent);
  currFunction = curr;
  lastPrintedLocation = std::nullopt;
  lastPrintIndent = 0;
  if (currFunction->prologLocation) {
    printDebugLocation(*currFunction->prologLocation);
  }
  handleSignature(curr, true);
  incIndent();
  for (size_t i = curr->getVarIndexBase(); i < curr->getNumLocals(); i++) {
    doIndent(o, indent);
    o << '(';
    printMinor(o, "local ");
    printLocal(i, currFunction, o) << ' ';
    printType(curr->getLocalType(i)) << ')';
    o << maybeNewLine;
  }
  // Print the body.
  StackIR* stackIR = nullptr;
  if (moduleStackIR) {
    stackIR = moduleStackIR->getStackIROrNull(curr);
  }
  if (stackIR) {
    printStackIR(stackIR, *this);
  } else {
    // It is ok to emit a block here, as a function can directly contain a
    // list, even if our ast avoids that for simplicity. We can just do that
    // optimization here..
    if (!full && curr->body->is<Block>() &&
        curr->body->cast<Block>()->name.isNull()) {
      Block* block = curr->body->cast<Block>();
      for (auto item : block->list) {
        printFullLine(item);
      }
    } else {
      printFullLine(curr->body);
    }
    assert(controlFlowDepth == 0);
  }
  if (currFunction->epilogLocation) {
    // Print last debug location: mix of decIndent and printDebugLocation
    // logic.
    doIndent(o, indent);
    if (!minify) {
      indent--;
    }
    printDebugLocation(*currFunction->epilogLocation);
    o << ')';
  } else {
    decIndent();
  }
  o << maybeNewLine;
}